

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O1

Reduction * add_Reduction(Parser *p,ZNode *z,SNode *sn,D_Reduction *reduction)

{
  Reduction **ppRVar1;
  char *pcVar2;
  char *pcVar3;
  ZNode *pZVar4;
  uint uVar5;
  Reduction *pRVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  Reduction **ppRVar11;
  
  ppRVar11 = &p->reductions_todo;
  if (z == (ZNode *)0x0) {
    uVar5 = 0x7fffffff;
  }
  else {
    uVar7 = (ulong)(z->sns).n;
    if (uVar7 == 0) {
      uVar5 = 0;
    }
    else {
      uVar9 = 0;
      uVar5 = 0;
      do {
        uVar10 = *(uint *)&(z->sns).v[uVar9]->field_0x24 & 0x7fffffff;
        if (uVar5 <= uVar10) {
          uVar5 = uVar10;
        }
        uVar9 = uVar9 + 1;
      } while (uVar7 != uVar9);
    }
  }
  if (*ppRVar11 != (Reduction *)0x0) {
    pcVar2 = (sn->loc).s;
    pRVar6 = *ppRVar11;
    do {
      pcVar3 = (pRVar6->snode->loc).s;
      if (pcVar2 < pcVar3) break;
      pZVar4 = pRVar6->znode;
      if (pZVar4 == (ZNode *)0x0) {
        uVar10 = 0x7fffffff;
      }
      else {
        uVar7 = (ulong)(pZVar4->sns).n;
        if (uVar7 == 0) {
          uVar10 = 0;
        }
        else {
          uVar9 = 0;
          uVar10 = 0;
          do {
            uVar8 = *(uint *)&(pZVar4->sns).v[uVar9]->field_0x24 & 0x7fffffff;
            if (uVar10 <= uVar8) {
              uVar10 = uVar8;
            }
            uVar9 = uVar9 + 1;
          } while (uVar7 != uVar9);
        }
      }
      if ((pcVar2 == pcVar3) && (uVar10 <= uVar5)) {
        if (uVar5 == uVar10) {
          do {
            if (((pRVar6->snode == sn) && (pRVar6->znode == z)) && (pRVar6->reduction == reduction))
            {
              return (Reduction *)0x0;
            }
            pRVar6 = pRVar6->next;
          } while (pRVar6 != (Reduction *)0x0);
        }
        break;
      }
      ppRVar1 = &pRVar6->next;
      ppRVar11 = &pRVar6->next;
      pRVar6 = *ppRVar1;
    } while (*ppRVar1 != (Reduction *)0x0);
  }
  pRVar6 = p->free_reductions;
  if (pRVar6 == (Reduction *)0x0) {
    pRVar6 = (Reduction *)malloc(0x30);
  }
  else {
    p->free_reductions = pRVar6->next;
  }
  pRVar6->znode = z;
  pRVar6->snode = sn;
  pRVar6->new_snode = (SNode *)0x0;
  sn->refcount = sn->refcount + 1;
  pRVar6->reduction = reduction;
  pRVar6->next = *ppRVar11;
  *ppRVar11 = pRVar6;
  return pRVar6;
}

Assistant:

static Reduction *add_Reduction(Parser *p, ZNode *z, SNode *sn, D_Reduction *reduction) {
  Reduction *x, **l = &p->reductions_todo;
  uint d = znode_depth(z), dd;
  for (x = p->reductions_todo; x; l = &x->next, x = x->next) {
    if (sn->loc.s < x->snode->loc.s) break;
    dd = znode_depth(x->znode);
    if ((sn->loc.s == x->snode->loc.s && d >= dd)) {
      if (d == dd)
        while (x) {
          if (sn == x->snode && z == x->znode && reduction == x->reduction) return NULL;
          x = x->next;
        }
      break;
    }
  }
  {
    Reduction *r = p->free_reductions;
    if (!r)
      r = MALLOC(sizeof *r);
    else
      p->free_reductions = r->next;
    r->znode = z;
    r->snode = sn;
    r->new_snode = NULL;
    ref_sn(sn);
    r->reduction = reduction;
    r->next = *l;
    *l = r;
    return r;
  }
}